

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::Merge
               (Image *in1,uint32_t startXIn1,uint32_t startYIn1,Image *in2,uint32_t startXIn2,
               uint32_t startYIn2,Image *in3,uint32_t startXIn3,uint32_t startYIn3,Image *out,
               uint32_t startXOut,uint32_t startYOut,uint32_t width,uint32_t height)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  imageException *this;
  uchar *puVar6;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  uchar *puVar7;
  uchar *puVar8;
  uchar *puVar9;
  uchar *puVar10;
  long lVar11;
  uchar *puVar12;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in1,startXIn1,startYIn1,in2,startXIn2,startYIn2,in3,startXIn3,startYIn3,width,height);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (out,startXOut,startYOut,width,height);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00132ba8;
  local_58._data = (uchar *)0x0;
  local_58._type = in2->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)in2,src);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00132ba8;
  local_80._data = (uchar *)0x0;
  local_80._type = in3->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)in3,src_00);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in1,&local_58,&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00132ba8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00132ba8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>(out);
  if (out->_colorCount == '\x03') {
    uVar2 = out->_rowSize;
    if (height * uVar2 != 0) {
      puVar6 = out->_data + (ulong)(startXOut * 3) + (ulong)(startYOut * uVar2);
      uVar3 = in3->_rowSize;
      puVar7 = puVar6 + height * uVar2;
      puVar8 = in3->_data + (ulong)startXIn3 + (ulong)(startYIn3 * uVar3);
      uVar4 = in2->_rowSize;
      puVar9 = in2->_data + (ulong)startXIn2 + (ulong)(startYIn2 * uVar4);
      uVar5 = in1->_rowSize;
      puVar10 = in1->_data + (ulong)startXIn1 + (ulong)(startYIn1 * uVar5);
      do {
        if (width != 0) {
          lVar11 = 0;
          puVar12 = puVar6;
          do {
            *puVar12 = puVar10[lVar11];
            puVar12[1] = puVar9[lVar11];
            puVar1 = puVar8 + lVar11;
            lVar11 = lVar11 + 1;
            puVar12[2] = *puVar1;
            puVar12 = puVar12 + 3;
          } while (puVar12 != puVar6 + width * 3);
        }
        puVar6 = puVar6 + uVar2;
        puVar10 = puVar10 + uVar5;
        puVar9 = puVar9 + uVar4;
        puVar8 = puVar8 + uVar3;
      } while (puVar6 != puVar7);
    }
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Color image is not 3-colored image");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Merge( const Image & in1, uint32_t startXIn1, uint32_t startYIn1, const Image & in2, uint32_t startXIn2, uint32_t startYIn2,
                const Image & in3, uint32_t startXIn3, uint32_t startYIn3, Image & out, uint32_t startXOut, uint32_t startYOut,
                uint32_t width, uint32_t height )
    {
        ParameterValidation ( in1, startXIn1, startYIn1, in2, startXIn2, startYIn2, in3, startXIn3, startYIn3, width, height );
        ParameterValidation ( out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in1, in2, in3 );
        VerifyRGBImage      ( out );

        const uint8_t colorCount = RGB;

        if( colorCount != out.colorCount() )
            throw imageException( "Color image is not 3-colored image" );

        const uint32_t rowSizeIn1 = in1.rowSize();
        const uint32_t rowSizeIn2 = in2.rowSize();
        const uint32_t rowSizeIn3 = in3.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        width = width * colorCount;

        const uint8_t * in1Y = in1.data() + startYIn1 * rowSizeIn1 + startXIn1;
        const uint8_t * in2Y = in2.data() + startYIn2 * rowSizeIn2 + startXIn2;
        const uint8_t * in3Y = in3.data() + startYIn3 * rowSizeIn3 + startXIn3;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSizeIn1, in2Y += rowSizeIn2, in3Y += rowSizeIn3 ) {
            const uint8_t * in1X = in1Y;
            const uint8_t * in2X = in2Y;
            const uint8_t * in3X = in3Y;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ) {
                *(outX++) = *(in1X++);
                *(outX++) = *(in2X++);
                *(outX++) = *(in3X++);
            }
        }
    }